

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsAppsExport.cpp
# Opt level: O1

void helicsAppFree(HelicsApp app)

{
  HelicsApp pvVar1;
  undefined8 local_20;
  undefined8 local_18;
  
  pvVar1 = (HelicsApp)0x0;
  if ((app != (HelicsApp)0x0) && (*(int *)((long)app + 0x34) == 0x7a8f1c4d)) {
    pvVar1 = app;
  }
  if (pvVar1 != (HelicsApp)0x0) {
    *(undefined4 *)((long)pvVar1 + 0x34) = 0;
    getMasterHolder();
    MasterObjectHolder::clearApp(local_20,*(int *)((long)pvVar1 + 0x30));
    if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
    }
  }
  helics::CoreFactory::cleanUpCores();
  return;
}

Assistant:

void helicsAppFree(HelicsApp app)
{
    auto* appObj = helics::getAppObject(app, nullptr);
    if (appObj != nullptr) {
        appObj->valid = 0;
        getMasterHolder()->clearApp(appObj->index);
    }

    helics::CoreFactory::cleanUpCores();
}